

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynCallArgument * ParseCallArgument(ParseContext *ctx)

{
  uint uVar1;
  Lexeme *begin;
  char *pcVar2;
  int iVar3;
  undefined4 extraout_var;
  SynBase *this_00;
  undefined4 extraout_var_00;
  SynCallArgument *this_01;
  undefined4 extraout_var_02;
  Lexeme *pLVar4;
  SynIdentifier *this;
  undefined4 extraout_var_01;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_string) {
    pcVar2 = begin->pos;
    uVar1 = begin->length;
    ctx->currentLexeme = begin + 1;
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    this = (SynIdentifier *)CONCAT44(extraout_var,iVar3);
    if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00216f2d;
    pLVar4 = ctx->currentLexeme + -1;
    SynBase::SynBase((SynBase *)this,4,pLVar4,pLVar4);
    (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
    (this->name).begin = pcVar2;
    (this->name).end = pcVar2 + uVar1;
    if (ctx->currentLexeme->type == lex_colon) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      this_00 = ParseAssignment(ctx);
      if (this_00 == (SynBase *)0x0) {
        anon_unknown.dwarf_169315::Report
                  (ctx,ctx->currentLexeme,
                   "ERROR: expression not found after \':\' in function argument list");
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])();
        this_00 = (SynBase *)CONCAT44(extraout_var_00,iVar3);
        SynBase::SynBase(this_00,0,ctx->currentLexeme,ctx->currentLexeme);
        this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6d30;
      }
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this_01 = (SynCallArgument *)CONCAT44(extraout_var_01,iVar3);
      pLVar4 = ctx->currentLexeme;
      if (pLVar4 <= ctx->firstLexeme) goto LAB_00216f2d;
      goto LAB_00216ef4;
    }
    ctx->currentLexeme = begin;
  }
  this_00 = ParseAssignment(ctx);
  if (this_00 == (SynBase *)0x0) {
    return (SynCallArgument *)0x0;
  }
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  this_01 = (SynCallArgument *)CONCAT44(extraout_var_02,iVar3);
  pLVar4 = ctx->currentLexeme;
  if (ctx->firstLexeme < pLVar4) {
    this = (SynIdentifier *)0x0;
LAB_00216ef4:
    SynBase::SynBase(&this_01->super_SynBase,0x18,begin,pLVar4 + -1);
    (this_01->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6a20;
    this_01->name = this;
    this_01->value = this_00;
    return this_01;
  }
LAB_00216f2d:
  __assert_fail("currentLexeme > firstLexeme",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0x19c,"Lexeme *ParseContext::Previous()");
}

Assistant:

SynCallArgument* ParseCallArgument(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.At(lex_string))
	{
		InplaceStr name = ctx.Consume();
		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

		if(ctx.Consume(lex_colon))
		{
			SynBase *value = ParseAssignment(ctx);

			if(!value)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after ':' in function argument list");

				value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			return new (ctx.get<SynCallArgument>()) SynCallArgument(start, ctx.Previous(), nameIdentifier, value);
		}
		else
		{
			// Backtrack
			ctx.currentLexeme = start;
		}
	}

	if(SynBase *value = ParseAssignment(ctx))
	{
		return new (ctx.get<SynCallArgument>()) SynCallArgument(start, ctx.Previous(), NULL, value);
	}

	return NULL;
}